

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse.c
# Opt level: O3

void set_add_znode(VecZNode *v,ZNode *z)

{
  uint uVar1;
  ZNode **ppZVar2;
  ulong uVar3;
  long lVar4;
  
  uVar1 = v->n;
  uVar3 = (ulong)uVar1;
  if (2 < uVar3) {
    if (uVar1 == 3) {
      ppZVar2 = v->v;
      v->n = 0;
      v->v = (ZNode **)0x0;
      lVar4 = 0;
      do {
        set_add_znode_hash(v,ppZVar2[lVar4]);
        lVar4 = lVar4 + 1;
      } while (lVar4 != 3);
    }
    set_add_znode_hash(v,z);
    return;
  }
  ppZVar2 = v->v;
  if (ppZVar2 == (ZNode **)0x0) {
    v->v = v->e;
    v->n = uVar1 + 1;
    v->e[uVar3] = z;
  }
  else {
    if ((ppZVar2 != v->e) && (uVar3 == 0)) {
      vec_add_internal(v,z);
      return;
    }
    v->n = uVar1 + 1;
    ppZVar2[uVar3] = z;
  }
  return;
}

Assistant:

static void set_add_znode(VecZNode *v, ZNode *z) {
  uint i, n = v->n;
  VecZNode vv;
  vec_clear(&vv);
  if (n < INTEGRAL_VEC_SIZE) {
    vec_add(v, z);
    return;
  }
  if (n == INTEGRAL_VEC_SIZE) {
    vv = *v;
    vec_clear(v);
    for (i = 0; i < n; i++) set_add_znode_hash(v, vv.v[i]);
  }
  set_add_znode_hash(v, z);
}